

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O3

QString * __thiscall
QDBusMenuAdaptor::status(QString *__return_storage_ptr__,QDBusMenuAdaptor *this)

{
  QLoggingCategory *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  undefined4 local_48;
  undefined8 uStack_44;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_30 = pQVar1->name;
    local_48 = 2;
    uStack_44 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_34 = 0;
    QMessageLogger::debug();
    QDebug::~QDebug(&local_20);
  }
  QVar2.m_data = &DAT_00000006;
  QVar2.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar2);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_48;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = (undefined4)uStack_44;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_44._4_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_3c;
  (__return_storage_ptr__->d).size = CONCAT44(uStack_34,uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDBusMenuAdaptor::status() const
{
    qCDebug(qLcMenu);
    return "normal"_L1;
}